

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_UInt FT_Face_GetCharVariantIndex(FT_Face face,FT_ULong charcode,FT_ULong variantSelector)

{
  code *UNRECOVERED_JUMPTABLE;
  FT_UInt FVar1;
  FT_CMap_conflict vcmap;
  FT_CharMap pFVar2;
  
  if (((face != (FT_Face)0x0) && (face->charmap != (FT_CharMap)0x0)) &&
     (face->charmap->encoding == FT_ENCODING_UNICODE)) {
    pFVar2 = find_variant_selector_charmap(face);
    if (pFVar2 != (FT_CharMap)0x0) {
      UNRECOVERED_JUMPTABLE = (code *)(pFVar2[1].face)->family_name;
      FVar1 = (*UNRECOVERED_JUMPTABLE)
                        (pFVar2,face->charmap,charcode & 0xffffffff,variantSelector & 0xffffffff,
                         UNRECOVERED_JUMPTABLE);
      return FVar1;
    }
  }
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_UInt )
  FT_Face_GetCharVariantIndex( FT_Face   face,
                               FT_ULong  charcode,
                               FT_ULong  variantSelector )
  {
    FT_UInt  result = 0;


    if ( face                                           &&
         face->charmap                                  &&
         face->charmap->encoding == FT_ENCODING_UNICODE )
    {
      FT_CharMap  charmap = find_variant_selector_charmap( face );
      FT_CMap     ucmap = FT_CMAP( face->charmap );


      if ( charmap )
      {
        FT_CMap  vcmap = FT_CMAP( charmap );


        if ( charcode > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "FT_Face_GetCharVariantIndex:"
                      " too large charcode" ));
          FT_TRACE1(( " 0x%lx is truncated\n", charcode ));
        }
        if ( variantSelector > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "FT_Face_GetCharVariantIndex:"
                      " too large variantSelector" ));
          FT_TRACE1(( " 0x%lx is truncated\n", variantSelector ));
        }

        result = vcmap->clazz->char_var_index( vcmap, ucmap,
                                               (FT_UInt32)charcode,
                                               (FT_UInt32)variantSelector );
      }
    }

    return result;
  }